

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-debug.c
# Opt level: O3

void print_data(coda_cursor *cursor,int compound_newline)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 uVar9;
  int64_t data_4;
  coda_native_type read_type;
  int has_attributes;
  char *field_name;
  int hidden;
  int is_union;
  coda_type_class type_class;
  int32_t data;
  int local_a8;
  undefined4 uStack_a4;
  int local_a0;
  undefined4 uStack_9c;
  int local_94;
  undefined8 local_90;
  int local_84;
  int local_80;
  undefined4 local_7c;
  uint local_78 [18];
  
  local_94 = 0;
  if (show_attributes != 0) {
    iVar2 = coda_cursor_has_attributes(cursor,&local_94);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    if (local_94 != 0) {
      if (compound_newline != 0) {
        ff_printf("\n");
        indent();
      }
      ff_printf("attr: ");
      iVar2 = coda_cursor_goto_attributes(cursor);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      INDENT = INDENT + 1;
      print_data(cursor,1);
      INDENT = INDENT + -1;
      coda_cursor_goto_parent(cursor);
      fi_printf("data: ");
      INDENT = INDENT + 1;
    }
  }
  iVar2 = coda_cursor_get_type_class(cursor,&local_7c);
  if (iVar2 != 0) {
    handle_coda_error();
  }
  switch(local_7c) {
  case 0:
    iVar2 = coda_cursor_get_num_elements(cursor,local_78);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    if (CONCAT44(local_78[1],local_78[0]) < 1) {
      pcVar5 = "{}\n";
      goto LAB_0010801c;
    }
    if (compound_newline != 0) {
      ff_printf("\n");
    }
    iVar2 = coda_cursor_get_type(cursor,&local_a8);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    iVar2 = coda_type_get_record_union_status(CONCAT44(uStack_a4,local_a8),&local_80);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    if (local_80 == 0) {
      iVar2 = coda_cursor_goto_first_record_field(cursor);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      if (0 < CONCAT44(local_78[1],local_78[0])) {
        bVar1 = 1;
        lVar3 = 0;
        do {
          iVar2 = coda_type_get_record_field_hidden_status
                            (CONCAT44(uStack_a4,local_a8),lVar3,&local_84);
          if (iVar2 != 0) {
            handle_coda_error();
          }
          if (local_84 == 0) {
            iVar2 = coda_type_get_record_field_name(CONCAT44(uStack_a4,local_a8),lVar3,&local_90);
            if (iVar2 != 0) {
              handle_coda_error();
            }
            if (!(bool)(compound_newline == 0 & bVar1)) {
              indent();
            }
            bVar1 = 0;
            ff_printf("%s: ",local_90);
            INDENT = INDENT + 1;
            print_data(cursor,1);
            INDENT = INDENT + -1;
          }
          if ((lVar3 < CONCAT44(local_78[1],local_78[0]) + -1) &&
             (iVar2 = coda_cursor_goto_next_record_field(cursor), iVar2 != 0)) {
            handle_coda_error();
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < CONCAT44(local_78[1],local_78[0]));
      }
    }
    else {
      iVar2 = coda_cursor_get_available_union_field_index(cursor,&local_a0);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      iVar2 = coda_type_get_record_field_name
                        (CONCAT44(uStack_a4,local_a8),CONCAT44(uStack_9c,local_a0),&local_90);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      iVar2 = coda_cursor_goto_record_field_by_index(cursor,CONCAT44(uStack_9c,local_a0));
      if (iVar2 != 0) {
        handle_coda_error();
      }
      if (compound_newline != 0) {
        indent();
      }
      ff_printf("%s: ",local_90);
      INDENT = INDENT + 1;
      print_data(cursor,1);
      INDENT = INDENT + -1;
    }
    break;
  case 1:
    iVar2 = coda_cursor_get_array_dim(cursor,&local_a8,local_78);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    if ((long)local_a8 < 0) {
LAB_00107fd0:
      pcVar5 = "[]\n";
      goto LAB_0010801c;
    }
    uVar8 = 1;
    if (local_a8 != 0) {
      lVar3 = 0;
      do {
        uVar8 = uVar8 * *(long *)(local_78 + lVar3 * 2);
        lVar3 = lVar3 + 1;
      } while (local_a8 != lVar3);
      if ((long)uVar8 < 1) goto LAB_00107fd0;
    }
    ff_printf("\n");
    iVar2 = coda_cursor_goto_first_array_element(cursor);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    uVar6 = 0;
    do {
      fi_printf("- ");
      INDENT = INDENT + 1;
      print_data(cursor,0);
      INDENT = INDENT + -1;
      if ((uVar6 < uVar8 - 1) && (iVar2 = coda_cursor_goto_next_array_element(cursor), iVar2 != 0))
      {
        handle_coda_error();
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    break;
  case 2:
  case 3:
  case 4:
  case 5:
    iVar2 = coda_cursor_get_read_type(cursor,&local_a0);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    switch(local_a0) {
    case 0:
    case 2:
    case 4:
      iVar2 = coda_cursor_read_int32(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      puVar4 = (uint *)(long)(int)local_78[0];
      pcVar5 = "%ld\n";
      break;
    case 1:
    case 3:
    case 5:
      iVar2 = coda_cursor_read_uint32(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      puVar4 = (uint *)(ulong)local_78[0];
      pcVar5 = "%lu\n";
      break;
    case 6:
      iVar2 = coda_cursor_read_int64(cursor,&local_a8);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      coda_str64(CONCAT44(uStack_a4,local_a8),local_78);
      goto LAB_0010811f;
    case 7:
      iVar2 = coda_cursor_read_uint64(cursor,&local_a8);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      coda_str64u(CONCAT44(uStack_a4,local_a8),local_78);
LAB_0010811f:
      puVar4 = local_78;
      pcVar5 = "%s\n";
      break;
    case 8:
    case 9:
      iVar2 = coda_cursor_read_double(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      uVar9 = CONCAT44(local_78[1],local_78[0]);
      pcVar5 = "%.16g\n";
      if (local_a0 == 8) {
        pcVar5 = "%.7g\n";
      }
      goto LAB_00108364;
    case 10:
      iVar2 = coda_cursor_read_char(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      ff_printf("\"");
      print_escaped((char *)local_78,1);
      pcVar5 = "\"\n";
LAB_0010801c:
      ff_printf(pcVar5);
      goto switchD_00107d2f_default;
    case 0xb:
      iVar2 = coda_cursor_get_string_length(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      sVar7 = CONCAT44(local_78[1],local_78[0]) + 1;
      pcVar5 = (char *)malloc(sVar7);
      if (pcVar5 == (char *)0x0) {
        coda_set_error(0xffffffff,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-yaml.c"
                       ,0x169);
        handle_coda_error();
        sVar7 = CONCAT44(local_78[1],local_78[0]) + 1;
      }
      iVar2 = coda_cursor_read_string(cursor,pcVar5,sVar7);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      ff_printf("\"");
      print_escaped(pcVar5,CONCAT44(local_78[1],local_78[0]));
      ff_printf("\"\n",CONCAT44(local_78[1],local_78[0]));
      goto LAB_001081e5;
    case 0xc:
      iVar2 = coda_cursor_get_bit_size(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      lVar3 = CONCAT44(local_78[1],local_78[0]);
      sVar7 = ((lVar3 >> 3) + 1) - (ulong)((local_78[0] & 7) == 0);
      pcVar5 = (char *)malloc(sVar7);
      if (pcVar5 == (char *)0x0) {
        coda_set_error(0xffffffff,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-yaml.c"
                       ,0x188);
        handle_coda_error();
        lVar3 = CONCAT44(local_78[1],local_78[0]);
      }
      iVar2 = coda_cursor_read_bits(cursor,pcVar5,0,lVar3);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      ff_printf("\"");
      print_escaped(pcVar5,sVar7);
      ff_printf("\"\n");
LAB_001081e5:
      free(pcVar5);
      goto switchD_00107d2f_default;
    case -1:
switchD_00107f64_caseD_0:
      pcVar5 = "null\n";
      goto LAB_0010801c;
    default:
      goto switchD_00107d2f_default;
    }
LAB_00108129:
    ff_printf(pcVar5,puVar4);
    goto switchD_00107d2f_default;
  case 6:
    iVar2 = coda_cursor_get_special_type(cursor,&local_a0);
    if (iVar2 != 0) {
      handle_coda_error();
    }
    switch(local_a0) {
    case 0:
      goto switchD_00107f64_caseD_0;
    case 1:
      iVar2 = coda_cursor_read_double(cursor,local_78);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      uVar9 = CONCAT44(local_78[1],local_78[0]);
      break;
    case 2:
      iVar2 = coda_cursor_read_double(cursor,&local_a8);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      iVar2 = coda_isNaN(CONCAT44(uStack_a4,local_a8));
      if ((iVar2 == 0) && (iVar2 = coda_isInf(CONCAT44(uStack_a4,local_a8)), iVar2 == 0)) {
        iVar2 = coda_time_double_to_string
                          (CONCAT44(uStack_a4,local_a8),"yyyy-MM-dd\'T\'HH:mm:ss.SSSSSS",local_78);
        if (iVar2 == 0) {
          pcVar5 = "%s\n";
          puVar4 = local_78;
          goto LAB_00108129;
        }
        pcVar5 = "\"{--invalid time value--}\"";
        goto LAB_0010801c;
      }
      uVar9 = CONCAT44(uStack_a4,local_a8);
      break;
    case 3:
      iVar2 = coda_cursor_read_complex_double_split(cursor,local_78,&local_a8);
      if (iVar2 != 0) {
        handle_coda_error();
      }
      ff_printf("%g + %gi\n",CONCAT44(local_78[1],local_78[0]),CONCAT44(uStack_a4,local_a8));
    default:
      goto switchD_00107d2f_default;
    }
    pcVar5 = "%.16g\n";
LAB_00108364:
    ff_printf(pcVar5,uVar9);
  default:
    goto switchD_00107d2f_default;
  }
  coda_cursor_goto_parent(cursor);
switchD_00107d2f_default:
  if (local_94 != 0) {
    INDENT = INDENT + -1;
  }
  return;
}

Assistant:

static void print_data(coda_cursor *cursor, int depth)
{
    coda_type_class type_class;
    int has_attributes;

    if (coda_cursor_has_attributes(cursor, &has_attributes) != 0)
    {
        handle_coda_error();
    }
    if (has_attributes)
    {
        if (coda_cursor_goto_attributes(cursor) != 0)
        {
            handle_coda_error();
        }
        fi_printf("{attributes}\n");
        INDENT++;
        print_data(cursor, depth);
        INDENT--;
        coda_cursor_goto_parent(cursor);
    }

    if (coda_cursor_get_type_class(cursor, &type_class) != 0)
    {
        handle_coda_error();
    }
    switch (type_class)
    {
        case coda_record_class:
            {
                long num_fields;

                if (coda_cursor_get_num_elements(cursor, &num_fields) != 0)
                {
                    handle_coda_error();
                }
                if (num_fields > 0)
                {
                    coda_type *record_type;
                    int is_union;
                    long i;

                    if (coda_cursor_get_type(cursor, &record_type) != 0)
                    {
                        handle_coda_error();
                    }

                    if (coda_type_get_record_union_status(record_type, &is_union) != 0)
                    {
                        handle_coda_error();
                    }
                    if (is_union)
                    {
                        const char *field_name;

                        if (coda_cursor_get_available_union_field_index(cursor, &i) != 0)
                        {
                            handle_coda_error();
                        }
                        if (coda_type_get_record_field_name(record_type, i, &field_name) != 0)
                        {
                            handle_coda_error();
                        }
                        if (coda_cursor_goto_record_field_by_index(cursor, i) != 0)
                        {
                            handle_coda_error();
                        }
                        fi_printf("[%s]", field_name);
                        if (print_offsets)
                        {
                            int64_t offset;

                            if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                            {
                                handle_coda_error();
                            }
                            if (offset >= 0)
                            {
                                char s[21];

                                coda_str64(offset >> 3, s);
                                ff_printf(":%s", s);
                                if ((offset & 0x7) != 0)
                                {
                                    ff_printf(":%d", (int)(offset & 0x7));
                                }
                            }
                        }
                        ff_printf("\n");
                        INDENT++;
                        if (max_depth < 0 || depth < max_depth)
                        {
                            print_data(cursor, depth + 1);
                        }
                        else
                        {
                            fi_printf("...\n");
                        }
                        INDENT--;
                        coda_cursor_goto_parent(cursor);
                    }
                    else
                    {
                        if (coda_cursor_goto_first_record_field(cursor) != 0)
                        {
                            handle_coda_error();
                        }
                        for (i = 0; i < num_fields; i++)
                        {
                            const char *field_name;

                            if (coda_type_get_record_field_name(record_type, i, &field_name) != 0)
                            {
                                handle_coda_error();
                            }
                            fi_printf("[%s]", field_name);
                            if (print_offsets)
                            {
                                int64_t offset;

                                if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                                {
                                    handle_coda_error();
                                }
                                if (offset >= 0)
                                {
                                    char s[21];

                                    coda_str64(offset >> 3, s);
                                    ff_printf(":%s", s);
                                    if ((offset & 0x7) != 0)
                                    {
                                        ff_printf(":%d", (int)(offset & 0x7));
                                    }
                                }
                            }
                            ff_printf("\n");
                            INDENT++;
                            if (max_depth < 0 || depth < max_depth)
                            {
                                print_data(cursor, depth + 1);
                            }
                            else
                            {
                                fi_printf("...\n");
                            }
                            INDENT--;
                            if (i < num_fields - 1)
                            {
                                if (coda_cursor_goto_next_record_field(cursor) != 0)
                                {
                                    handle_coda_error();
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                }
            }
            break;
        case coda_array_class:
            {
                long dim[CODA_MAX_NUM_DIMS];
                int num_dims;
                long num_elements;

                if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
                {
                    handle_coda_error();
                }
                if (num_dims >= 0)
                {
                    int index[CODA_MAX_NUM_DIMS];
                    int i;

                    num_elements = 1;
                    for (i = 0; i < num_dims; i++)
                    {
                        num_elements *= dim[i];
                        index[i] = 0;
                    }
                    if (num_elements > 0)
                    {
                        if (coda_cursor_goto_first_array_element(cursor) != 0)
                        {
                            handle_coda_error();
                        }
                        for (i = 0; i < num_elements; i++)
                        {
                            int k;

                            fi_printf("(");
                            for (k = 0; k < num_dims; k++)
                            {
                                ff_printf("%d", index[k]);
                                if (k < num_dims - 1)
                                {
                                    ff_printf(",");
                                }
                            }
                            ff_printf(")");
                            if (print_offsets)
                            {
                                int64_t offset;

                                if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                                {
                                    handle_coda_error();
                                }
                                if (offset >= 0)
                                {
                                    char s[21];

                                    coda_str64(offset >> 3, s);
                                    ff_printf(":%s", s);
                                    if ((offset & 0x7) != 0)
                                    {
                                        ff_printf(":%d", (int)(offset & 0x7));
                                    }
                                }
                            }
                            ff_printf("\n");
                            INDENT++;
                            if (max_depth < 0 || depth < max_depth)
                            {
                                print_data(cursor, depth + 1);
                            }
                            else
                            {
                                fi_printf("...\n");
                            }
                            INDENT--;

                            k = num_dims - 1;
                            while (k >= 0)
                            {
                                index[k]++;
                                if (index[k] == dim[k])
                                {
                                    index[k--] = 0;
                                }
                                else
                                {
                                    break;
                                }
                            }
                            if (i < num_elements - 1)
                            {
                                if (coda_cursor_goto_next_array_element(cursor) != 0)
                                {
                                    handle_coda_error();
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                }
            }
            break;
        case coda_integer_class:
        case coda_real_class:
        case coda_text_class:
        case coda_raw_class:
            {
                coda_native_type read_type;
                int has_ascii_content;

                if (coda_cursor_has_ascii_content(cursor, &has_ascii_content) != 0)
                {
                    handle_coda_error();
                }
                if (has_ascii_content)
                {
                    long length;
                    char *data;

                    if (coda_cursor_get_string_length(cursor, &length) != 0)
                    {
                        handle_coda_error();
                    }
                    data = (char *)malloc(length + 1);
                    if (data == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                       "out of memory (could not allocate %lu bytes) (%s:%u)",
                                       (long)length + 1, __FILE__, __LINE__);
                        handle_coda_error();
                    }
                    if (coda_cursor_read_string(cursor, data, length + 1) != 0)
                    {
                        handle_coda_error();
                    }

                    fi_printf("\"");
                    print_escaped(data, length);
                    ff_printf("\" (length=%ld)\n", length);
                    free(data);
                }

                if (coda_cursor_get_read_type(cursor, &read_type) != 0)
                {
                    handle_coda_error();
                }
                switch (read_type)
                {
                    case coda_native_type_bytes:
                        {
                            int64_t bit_size;
                            int64_t byte_size;
                            uint8_t *data;
                            char s[21];

                            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
                            {
                                handle_coda_error();
                            }
                            byte_size = (bit_size >> 3) + (bit_size & 0x7 ? 1 : 0);
                            data = (uint8_t *)malloc((size_t)byte_size);
                            if (data == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)",
                                               (long)byte_size, __FILE__, __LINE__);
                                handle_coda_error();
                            }
                            if (coda_cursor_read_bits(cursor, data, 0, bit_size) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("\"");
                            print_escaped((char *)data, (long)byte_size);
                            ff_printf("\" (size=");
                            coda_str64(bit_size >> 3, s);
                            ff_printf("%s", s);
                            if ((bit_size & 0x7) != 0)
                            {
                                ff_printf(":%d", (int)(bit_size & 0x7));
                            }
                            ff_printf(")\n");

                            free(data);
                        }
                        break;
                    case coda_native_type_int8:
                    case coda_native_type_int16:
                    case coda_native_type_int32:
                        {
                            int32_t data;

                            if (coda_cursor_read_int32(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("%ld\n", (long)data);
                        }
                        break;
                    case coda_native_type_uint8:
                    case coda_native_type_uint16:
                    case coda_native_type_uint32:
                        {
                            uint32_t data;

                            if (coda_cursor_read_uint32(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("%lu\n", (unsigned long)data);
                        }
                        break;
                    case coda_native_type_int64:
                        {
                            int64_t data;
                            char s[21];

                            if (coda_cursor_read_int64(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            coda_str64(data, s);
                            fi_printf("%s\n", s);
                        }
                        break;
                    case coda_native_type_uint64:
                        {
                            uint64_t data;
                            char s[21];

                            if (coda_cursor_read_uint64(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            coda_str64u(data, s);
                            fi_printf("%s\n", s);
                        }
                        break;
                    case coda_native_type_float:
                    case coda_native_type_double:
                        {
                            double data;

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            if (read_type == coda_native_type_float)
                            {
                                fi_printf("%.7g\n", data);
                            }
                            else
                            {
                                fi_printf("%.16g\n", data);
                            }
                        }
                        break;
                    case coda_native_type_char:
                    case coda_native_type_string:
                    case coda_native_type_not_available:
                        assert(has_ascii_content);
                        break;
                }
            }
            break;
        case coda_special_class:
            {
                coda_special_type special_type;

                if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                {
                    handle_coda_error();
                }

                if (special_type != coda_special_no_data)
                {
                    coda_cursor base_cursor = *cursor;

                    if (coda_cursor_use_base_type_of_special_type(&base_cursor) != 0)
                    {
                        handle_coda_error();
                    }
                    print_data(&base_cursor, depth);
                }

                fi_printf("<%s>", coda_type_get_special_type_name(special_type));
                switch (special_type)
                {
                    case coda_special_no_data:
                        ff_printf("\n");
                        break;
                    case coda_special_vsf_integer:
                        {
                            double data;

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            ff_printf("%.16g\n", data);
                        }
                        break;
                    case coda_special_time:
                        {
                            double data;
                            char str[27];

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }
                            if (coda_isNaN(data) || coda_isInf(data))
                            {
                                ff_printf(" %.16g\n", data);
                            }
                            else
                            {
                                if (coda_time_double_to_string(data, "yyyy-MM-dd HH:mm:ss.SSSSSS", str) != 0)
                                {
                                    ff_printf(" {--invalid time value--}\n");
                                }
                                else
                                {
                                    ff_printf(" %s\n", str);
                                }
                            }
                        }
                        break;
                    case coda_special_complex:
                        {
                            double re, im;

                            if (coda_cursor_read_complex_double_split(cursor, &re, &im) != 0)
                            {
                                handle_coda_error();
                            }

                            ff_printf(" %g + %gi\n", re, im);
                        }
                        break;
                }
            }
            break;
    }
}